

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cw_download_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  undefined1 *puVar1;
  byte *pbVar2;
  void *pvVar3;
  curl_trc_feat *pcVar4;
  long lVar5;
  Curl_cwriter *pCVar6;
  uint uVar7;
  CURLcode CVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((type & 0x10U) == 0) {
    pvVar3 = writer->ctx;
    if ((*(byte *)((long)pvVar3 + 0x20) & 1) == 0) {
      Curl_pgrsTime(data,TIMER_STARTTRANSFER);
      pbVar2 = (byte *)((long)pvVar3 + 0x20);
      *pbVar2 = *pbVar2 | 1;
    }
    if ((type & 1U) == 0) {
LAB_0014d3cd:
      pCVar6 = writer->next;
      if (pCVar6 == (Curl_cwriter *)0x0) {
        CVar8 = CURLE_WRITE_ERROR;
      }
      else {
        CVar8 = (*pCVar6->cwt->do_write)(data,pCVar6,type,buf,nbytes);
      }
      if (data == (Curl_easy *)0x0) {
        return CVar8;
      }
      if (((data->set).field_0x897 & 0x40) == 0) {
        return CVar8;
      }
      pcVar4 = (data->state).feat;
      if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
        return CVar8;
      }
      if (Curl_trc_feat_write.log_level < 1) {
        return CVar8;
      }
      Curl_trc_write(data,"download_write header(type=%x, blen=%zu) -> %d",(ulong)(uint)type,nbytes,
                     (ulong)CVar8);
      return CVar8;
    }
  }
  else if ((type & 1U) == 0) {
    if (((data->set).field_0x899 & 0x20) != 0) {
      return CURLE_OK;
    }
    goto LAB_0014d3cd;
  }
  uVar7 = *(uint *)&(data->req).field_0xd9;
  if (nbytes != 0 && (uVar7 >> 0x11 & 1) != 0) {
    Curl_conncontrol(data->conn,2);
    if ((((data->set).field_0x897 & 0x40) != 0) &&
       (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"download_write body(type=%x, blen=%zu), did not want a BODY",
                     (ulong)(uint)type,nbytes);
    }
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 | 8;
    return (uint)((data->info).header_size == 0) << 3;
  }
  lVar11 = (data->req).maxdownload;
  if (lVar11 == -1) {
    lVar12 = 0;
    uVar13 = nbytes;
  }
  else {
    lVar5 = (data->req).bytecount;
    uVar10 = lVar11 - lVar5;
    uVar13 = 0;
    if (0 < (long)uVar10) {
      uVar13 = uVar10;
    }
    bVar14 = nbytes < uVar13;
    lVar12 = nbytes - uVar13;
    if (bVar14) {
      lVar12 = 0;
    }
    if (bVar14 || nbytes - uVar13 == 0) {
      uVar13 = nbytes;
    }
    if (!bVar14) {
      uVar7 = uVar7 | 8;
      *(uint *)&(data->req).field_0xd9 = uVar7;
    }
    if (lVar5 < lVar11 && ((uVar7 >> 0x11 & 1) == 0 && (char)type < '\0')) {
      Curl_failf(data,"end of response with %ld bytes missing");
      return CURLE_PARTIAL_FILE;
    }
  }
  lVar11 = (data->set).max_filesize;
  if (lVar11 == 0) {
    if ((uVar7 >> 10 & 1) != 0) goto LAB_0014d640;
  }
  else {
    if ((uVar7 >> 10 & 1) != 0) goto LAB_0014d640;
    if (lVar11 == -1) {
      uVar10 = 0xffffffffffffffff;
    }
    else {
      uVar9 = lVar11 - (data->req).bytecount;
      uVar10 = 0;
      if (0 < (long)uVar9) {
        uVar10 = uVar9;
      }
    }
    if (uVar10 <= uVar13) {
      uVar13 = uVar10;
    }
  }
  if (((char)type < '\0') || (uVar13 != 0)) {
    pCVar6 = writer->next;
    if (pCVar6 == (Curl_cwriter *)0x0) {
      CVar8 = CURLE_WRITE_ERROR;
    }
    else {
      CVar8 = (*pCVar6->cwt->do_write)(data,pCVar6,type,buf,uVar13);
    }
    if (((((data->set).field_0x897 & 0x40) != 0) &&
        ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"download_write body(type=%x, blen=%zu) -> %d",(ulong)(uint)type,nbytes,
                     (ulong)CVar8);
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  else {
    uVar13 = 0;
  }
LAB_0014d640:
  lVar11 = (data->req).bytecount + uVar13;
  (data->req).bytecount = lVar11;
  CVar8 = Curl_pgrsSetDownloadCounter(data,lVar11);
  if (CVar8 == CURLE_OK) {
    if (lVar12 == 0) {
      CVar8 = CURLE_OK;
      if ((uVar13 < nbytes) && (((data->req).field_0xda & 4) == 0)) {
        Curl_failf(data,"Exceeded the maximum allowed file size (%ld) with %ld bytes",
                   (data->set).max_filesize,(data->req).bytecount);
        CVar8 = CURLE_FILESIZE_EXCEEDED;
      }
    }
    else {
      CVar8 = CURLE_OK;
      if (((data->req).field_0xda & 4) == 0) {
        if ((((data->set).field_0x897 & 0x40) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,
                     "Excess found writing body: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld"
                     ,lVar12,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
        }
        Curl_conncontrol(data->conn,1);
      }
    }
  }
  return CVar8;
}

Assistant:

static CURLcode cw_download_write(struct Curl_easy *data,
                                  struct Curl_cwriter *writer, int type,
                                  const char *buf, size_t nbytes)
{
  struct cw_download_ctx *ctx = writer->ctx;
  CURLcode result;
  size_t nwrite, excess_len = 0;
  bool is_connect = !!(type & CLIENTWRITE_CONNECT);

  if(!is_connect && !ctx->started_response) {
    Curl_pgrsTime(data, TIMER_STARTTRANSFER);
    ctx->started_response = TRUE;
  }

  if(!(type & CLIENTWRITE_BODY)) {
    if(is_connect && data->set.suppress_connect_headers)
      return CURLE_OK;
    result = Curl_cwriter_write(data, writer->next, type, buf, nbytes);
    CURL_TRC_WRITE(data, "download_write header(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    return result;
  }

  /* Here, we deal with REAL BODY bytes. All filtering and transfer
   * encodings have been applied and only the true content, e.g. BODY,
   * bytes are passed here.
   * This allows us to check sizes, update stats, etc. independent
   * from the protocol in play. */

  if(data->req.no_body && nbytes > 0) {
    /* BODY arrives although we want none, bail out */
    streamclose(data->conn, "ignoring body");
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu), "
                   "did not want a BODY", type, nbytes);
    data->req.download_done = TRUE;
    if(data->info.header_size)
      /* if headers have been received, this is fine */
      return CURLE_OK;
    return CURLE_WEIRD_SERVER_REPLY;
  }

  /* Determine if we see any bytes in excess to what is allowed.
   * We write the allowed bytes and handle excess further below.
   * This gives deterministic BODY writes on varying buffer receive
   * lengths. */
  nwrite = nbytes;
  if(-1 != data->req.maxdownload) {
    size_t wmax = get_max_body_write_len(data, data->req.maxdownload);
    if(nwrite > wmax) {
      excess_len = nbytes - wmax;
      nwrite = wmax;
    }

    if(nwrite == wmax) {
      data->req.download_done = TRUE;
    }

    if((type & CLIENTWRITE_EOS) && !data->req.no_body &&
       (data->req.maxdownload > data->req.bytecount)) {
      failf(data, "end of response with %" FMT_OFF_T " bytes missing",
            data->req.maxdownload - data->req.bytecount);
      return CURLE_PARTIAL_FILE;
    }
  }

  /* Error on too large filesize is handled below, after writing
   * the permitted bytes */
  if(data->set.max_filesize && !data->req.ignorebody) {
    size_t wmax = get_max_body_write_len(data, data->set.max_filesize);
    if(nwrite > wmax) {
      nwrite = wmax;
    }
  }

  if(!data->req.ignorebody && (nwrite || (type & CLIENTWRITE_EOS))) {
    result = Curl_cwriter_write(data, writer->next, type, buf, nwrite);
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    if(result)
      return result;
  }
  /* Update stats, write and report progress */
  data->req.bytecount += nwrite;
  result = Curl_pgrsSetDownloadCounter(data, data->req.bytecount);
  if(result)
    return result;

  if(excess_len) {
    if(!data->req.ignorebody) {
      infof(data,
            "Excess found writing body:"
            " excess = %zu"
            ", size = %" FMT_OFF_T
            ", maxdownload = %" FMT_OFF_T
            ", bytecount = %" FMT_OFF_T,
            excess_len, data->req.size, data->req.maxdownload,
            data->req.bytecount);
      connclose(data->conn, "excess found in a read");
    }
  }
  else if((nwrite < nbytes) && !data->req.ignorebody) {
    failf(data, "Exceeded the maximum allowed file size "
          "(%" FMT_OFF_T ") with %" FMT_OFF_T " bytes",
          data->set.max_filesize, data->req.bytecount);
    return CURLE_FILESIZE_EXCEEDED;
  }

  return CURLE_OK;
}